

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

void __thiscall
RuntimeObjectSystem::CompileAllInProject
          (RuntimeObjectSystem *this,bool bForceRecompile,unsigned_short projectId_)

{
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  AUDynArray<IObjectConstructor_*> constructors;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  bool local_68;
  vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *local_60;
  ProjectSettings *local_58;
  string local_50;
  
  local_58 = GetProject(this,projectId_);
  local_60 = &local_58->m_BuildFileList;
  std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::_M_erase_at_end
            (local_60,(local_58->m_BuildFileList).
                      super__Vector_base<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  if (this->m_bAutoCompile == false) {
    AUDynArray<IObjectConstructor_*>::AUDynArray((AUDynArray<IObjectConstructor_*> *)local_90,0);
    (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[4])
              (this->m_pObjectFactorySystem,(AUDynArray<IObjectConstructor_*> *)local_90);
    SetupRuntimeFileTracking(this,(IAUDynArray<IObjectConstructor_*> *)local_90);
    AUDynArray<IObjectConstructor_*>::~AUDynArray((AUDynArray<IObjectConstructor_*> *)local_90);
  }
  pPVar1 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar1[projectId_].m_RuntimeFileList.
      super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      pPVar1[projectId_].m_RuntimeFileList.
      super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0x10;
    uVar6 = 0;
    do {
      pPVar2 = (local_58->m_RuntimeFileList).
               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_90 = (undefined1  [8])&PTR__Path_001198d8;
      local_88._M_p = (pointer)&local_78;
      lVar3 = *(long *)((long)pPVar2 + lVar5 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,lVar3,*(long *)((long)&pPVar2->_vptr_Path + lVar5) + lVar3);
      local_68 = true;
      FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,(Path *)local_90);
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 != 0) {
        std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::push_back
                  (local_60,(value_type *)local_90);
      }
      local_90 = (undefined1  [8])&PTR__Path_001198d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      pPVar1 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x28;
    } while (uVar6 < (ulong)(((long)pPVar1[projectId_].m_RuntimeFileList.
                                    super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&pPVar1[projectId_].m_RuntimeFileList.
                                        super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                        ._M_impl.super__Vector_impl_data >> 3) * -0x3333333333333333
                            ));
  }
  StartRecompile(this);
  return;
}

Assistant:

void RuntimeObjectSystem::CompileAllInProject( bool bForceRecompile, unsigned short projectId_ )
{
    (void)bForceRecompile;
    ProjectSettings& project = GetProject( projectId_ );
    // since this is a compile all we can clear any pending compiles
    project.m_BuildFileList.clear( );

	// ensure we have an up to date list of files to commpile if autocompile is off
	if( !m_bAutoCompile )
	{
		AUDynArray<IObjectConstructor*> constructors;
		m_pObjectFactorySystem->GetAll(constructors);
		SetupRuntimeFileTracking(constructors);
	}

	// add all files except headers
    for( size_t i = 0; i < m_Projects[ projectId_ ].m_RuntimeFileList.size( ); ++i )
	{
        BuildTool::FileToBuild fileToBuild( project.m_RuntimeFileList[ i ], true ); //force re-compile on compile all
		if( fileToBuild.filePath.Extension() != ".h") //TODO: change to check for .cpp and .c as could have .inc files etc.?
		{
            project.m_BuildFileList.push_back( fileToBuild );
		}
	}

	StartRecompile();
}